

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  byte bVar1;
  byte bVar2;
  CURLcode CVar3;
  byte *pbVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  
  if (length == 0) {
    length = strlen(string);
  }
  pbVar4 = (byte *)(*Curl_cmalloc)(length + 1);
  if (pbVar4 == (byte *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ostring = (char *)pbVar4;
    for (; length != 0; length = length + lVar6) {
      bVar5 = *string;
      lVar6 = -1;
      lVar7 = 1;
      if (2 < length && bVar5 == 0x25) {
        bVar1 = ((byte *)string)[1];
        if (((byte)(bVar1 - 0x30) < 10) ||
           ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))))
        {
          bVar2 = ((byte *)string)[2];
          if (((byte)(bVar2 - 0x30) < 10) ||
             ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))
             ) {
            bVar5 = (&DAT_001818a0)[bVar2] & 0xf | (&DAT_001818a0)[bVar1] << 4;
            lVar6 = -3;
            lVar7 = 3;
          }
        }
      }
      if ((ctrl == REJECT_CTRL && bVar5 < 0x20) || (ctrl == REJECT_ZERO && bVar5 == 0)) {
        (*Curl_cfree)(*ostring);
        *ostring = (char *)0x0;
        return CURLE_URL_MALFORMAT;
      }
      string = (char *)((byte *)string + lVar7);
      *pbVar4 = bVar5;
      pbVar4 = pbVar4 + 1;
    }
    *pbVar4 = 0;
    CVar3 = CURLE_OK;
    if (olen != (size_t *)0x0) {
      *olen = (long)pbVar4 - (long)*ostring;
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length ? length : strlen(string));
  ns = malloc(alloc + 1);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  /* store output string */
  *ostring = ns;

  while(alloc) {
    unsigned char in = (unsigned char)*string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      in = (unsigned char)((Curl_hexval(string[1]) << 4) |
                           Curl_hexval(string[2]));
      string += 3;
      alloc -= 3;
    }
    else {
      string++;
      alloc--;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      Curl_safefree(*ostring);
      return CURLE_URL_MALFORMAT;
    }

    *ns++ = (char)in;
  }
  *ns = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = ns - *ostring;

  return CURLE_OK;
}